

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promise.h
# Opt level: O2

shared_ptr<Promise> __thiscall Promise::Register(Promise *this,shared_ptr<Promise> *p)

{
  element_type *peVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<Promise> sVar3;
  
  peVar2 = (p->super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2->is_registered == false) {
    std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::push_back
              (&entries,p);
    peVar2 = (p->super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    peVar2->is_registered = true;
    in_RDX._M_pi = extraout_RDX;
  }
  this->_vptr_Promise = (_func_int **)peVar2;
  peVar1 = (element_type *)
           (p->super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (p->super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_enable_shared_from_this<Promise>)._M_weak_this.
  super___weak_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (p->super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  sVar3.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  sVar3.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Promise>)sVar3.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static PromisePtr Register(PromisePtr p) {
    if (p->is_registered)
      return p;
    entries.push_back(p);
    p->is_registered = true;
    return p;
  }